

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O2

void __thiscall Listener::Listener(Listener *this)

{
  (this->super_actor).context_.object_ = (object_t *)0x0;
  (this->super_actor).self_.object_ = (object_t *)0x0;
  (this->super_actor).handlers_._M_h._M_buckets =
       &(this->super_actor).handlers_._M_h._M_single_bucket;
  (this->super_actor).handlers_._M_h._M_bucket_count = 1;
  (this->super_actor).handlers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_actor).handlers_._M_h._M_element_count = 0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_actor).handlers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined2 *)&(this->super_actor).terminating_ = 0;
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__actor_0010f978;
  this->m_counter = 0;
  acto::actor::handler<msg_loop,Listener,msg_loop_const&>(&this->super_actor,0x104412);
  acto::actor::handler<msg_start,Listener,msg_start_const&>(&this->super_actor,0x104510);
  acto::actor::handler<msg_stop,Listener,msg_stop_const&>(&this->super_actor,0x104604);
  return;
}

Assistant:

Listener()
    : m_active(false)
    , m_counter(0)
  {
    handler< msg_loop  >(&Listener::doLoop);
    handler< msg_start >(&Listener::doStart);
    handler< msg_stop  >(&Listener::doStop);
  }